

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

bool __thiscall tinyusdz::value::TimeSamples::has_sample_at(TimeSamples *this,double t)

{
  Sample *pSVar1;
  bool bVar2;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  __it;
  long lVar3;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  _Var4;
  long lVar5;
  double *local_40;
  double t_local;
  
  t_local = t;
  if (this->_dirty == true) {
    update(this);
  }
  __it._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = &t_local;
  lVar5 = (long)pSVar1 - (long)__it._M_current;
  for (lVar3 = lVar5 / 0x28 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::operator()
                      ((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0> *)
                       &local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_00229bc9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::operator()
                      ((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0> *)
                       &local_40,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_00229bc9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::operator()
                      ((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0> *)
                       &local_40,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_00229bc9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::operator()
                      ((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0> *)
                       &local_40,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_00229bc9;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0xa0;
  }
  lVar5 = lVar5 / 0x28;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = pSVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::
                  operator()((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0>
                              *)&local_40,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_00229bc9;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::operator()
                      ((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0> *)
                       &local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_00229bc9;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::$_0>::operator()
                    ((_Iter_pred<tinyusdz::value::TimeSamples::has_sample_at(double)const::__0> *)
                     &local_40,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pSVar1;
  }
LAB_00229bc9:
  return _Var4._M_current != pSVar1;
}

Assistant:

bool TimeSamples::has_sample_at(const double t) const {
  if (_dirty) {
    update();
  }

  const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &s) {
    return math::is_close(t, s.t);
  });

  return (it != _samples.end());
}